

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg.h
# Opt level: O2

bool __thiscall svg::Document::save(Document *this)

{
  int iVar1;
  long local_238;
  ofstream ofs;
  int aiStack_218 [120];
  string local_38;
  
  std::ofstream::ofstream(&local_238,(this->file_name)._M_dataplus._M_p,_S_out);
  iVar1 = *(int *)((long)aiStack_218 + *(long *)(local_238 + -0x18));
  if (iVar1 == 0) {
    toString_abi_cxx11_(&local_38,this);
    std::operator<<((ostream *)&local_238,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::ofstream::close();
  }
  std::ofstream::~ofstream(&local_238);
  return iVar1 == 0;
}

Assistant:

bool save() const
        {
            std::ofstream ofs(file_name.c_str());
            if (!ofs.good())
                return false;

            ofs << toString();
            ofs.close();
            return true;
        }